

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86instimpl.cpp
# Opt level: O3

Error asmjit::X86InstImpl::validate
                (uint32_t archType,Detail *detail,Operand_ *operands,uint32_t count)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  anon_union_16_7_ed616b9d_for_Operand__0 *paVar6;
  Error EVar7;
  ulong uVar8;
  byte *pbVar9;
  Error EVar10;
  ulong uVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  undefined1 *puVar15;
  Operand_ *pOVar16;
  byte *pbVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  byte bVar24;
  ulong uVar25;
  ushort uVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  bool bVar30;
  bool bVar31;
  OSignature oSigTranslated [6];
  Operand_ *local_a0;
  uint uStack_68;
  ushort uStack_64;
  byte abStack_61 [49];
  
  uVar25 = (ulong)count;
  if (2 < archType - 1) {
    return 5;
  }
  puVar15 = _x86ValidationData;
  if (archType != 1) {
    puVar15 = _x64ValidationData;
  }
  if (0x59b < (ulong)detail->instId) {
    return 3;
  }
  uVar2 = detail->options;
  uVar18 = *(uint *)(X86InstDB::instData + (ulong)detail->instId * 0xc);
  uVar3 = *(uint *)(X86InstDB::commonData + (ulong)(uVar18 >> 0x16) * 0xc);
  if ((uVar2 & 0x32000) != 0) {
    if ((uVar2 >> 0xd & 1) != 0) {
      if (count == 0) {
        return 0x1c;
      }
      if ((uVar3 & 0x4000) == 0 && (uVar2 & 0x30000) == 0) {
        return 0x1c;
      }
      if (((operands->field_0)._any.signature & 7) != 2) {
        return 0x1c;
      }
    }
    if ((uVar2 & 0x30000) != 0) {
      if ((uVar2 >> 0xd & 1) == 0) {
        return 0x1b;
      }
      if ((uVar2 & 0x30000) == 0x30000) {
        return 0x1b;
      }
      if (((uVar2 >> 0x10 & 1) != 0) && ((uVar3 & 0x8000) == 0)) {
        return 0x1d;
      }
      if (((uVar2 >> 0x11 & 1) != 0) && ((uVar3 & 0x10000) == 0)) {
        return 0x1e;
      }
    }
  }
  uVar22 = uVar2 & 0xc000;
  if (uVar22 != 0) {
    if (uVar22 == 0xc000) {
      return 0x1b;
    }
    if (((uVar2 >> 0xe & 1) != 0) && ((uVar3 & 0x1000) == 0)) {
      return 0x1f;
    }
    if (((short)uVar2 < 0) && ((uVar3 & 0x2000) == 0)) {
      return 0x1f;
    }
  }
  if (count == 0) {
    local_a0 = (Operand_ *)0x0;
    uVar29 = 0;
    uVar28 = 0;
    uVar13 = 0;
LAB_00166913:
    if (archType == 1) {
      if ((uVar28 & 0x10) != 0) {
        return 0x32;
      }
    }
    else if (((uVar28 & 2) != 0) && (0xff < uVar29)) {
      return 0x31;
    }
    uVar11 = (ulong)uVar13;
    uVar25 = *(ulong *)(X86InstDB::commonData + (ulong)(uVar18 >> 0x16) * 0xc + 4) >> 0x32;
    if ((uVar25 & 0xf) == 0) {
LAB_00166bb6:
      uVar18 = (detail->extraReg)._signature;
      if ((uVar2 & 0x9c0000) != 0 || uVar18 != 0) {
        if ((uVar3 >> 0x14 & 1) == 0) {
          EVar7 = 0;
          EVar10 = 0x16;
          if (uVar22 == 0) {
            EVar7 = 0x16;
          }
          bVar31 = (uVar2 & 0x9c0000) == 0;
          goto LAB_00166c00;
        }
        if (uVar18 != 0) {
          if ((uVar18 & 0xf8) != 0x90) {
            return 0x21;
          }
          if ((uVar3 >> 0x18 & 1) == 0) {
            return 0x22;
          }
        }
        if (((uVar2 >> 0x17 & 1) != 0) && ((uVar3 & 0x2000000) == 0)) {
          return 0x23;
        }
        if ((uVar2 >> 0x14 & 1) != 0) {
          if (local_a0 == (Operand_ *)0x0) {
            return 0x24;
          }
          uVar18 = (local_a0->field_0)._any.signature;
          if (0xffffff < uVar18) {
            uVar18 = uVar18 >> 0x18;
            if (((uVar3 >> 0x1c & 1) != 0) && (uVar18 != 4)) {
              return 0x24;
            }
            if (((uVar3 >> 0x1d & 1) != 0) && (uVar18 != 8)) {
              return 0x24;
            }
          }
        }
        if ((uVar2 & 0xc0000) != 0) {
          if (local_a0 != (Operand_ *)0x0) {
            return 0x25;
          }
          if ((uVar2 >> 0x12 & 1) == 0) {
            if ((uVar3 >> 0x1b & 1) == 0) {
              return 0x25;
            }
            return 0;
          }
          if ((uVar3 >> 0x1a & 1) == 0) {
            return 0x25;
          }
          if ((uVar3 & 0x30000000) != 0) {
            if (uVar13 < 2) {
              validate();
            }
            if ((operands->field_0)._any.signature != 0x40000159) {
              if (operands[1].field_0._any.signature != 0x40000159) {
                return 0x25;
              }
              return 0;
            }
          }
        }
      }
      return 0;
    }
    uVar27 = *(ulong *)(X86InstDB::commonData + (ulong)(uVar18 >> 0x16) * 0xc + 4) >> 0x28;
    pbVar9 = X86InstDB::iSignatureData + (uVar27 & 0x3ff) * 8;
    pbVar1 = pbVar9 + (uVar25 & 0xf) * 8;
    lVar21 = (uVar27 & 0x3ff) * 8 + 0x177842;
    bVar12 = false;
    bVar31 = false;
    do {
      bVar24 = *pbVar9;
      if ((byte)(bVar24 >> 3 & (archType != 1) + 1U) != 0) {
        uVar18 = bVar24 & 7;
        if (uVar13 == uVar18) {
          if (uVar11 == 0) {
LAB_00166b73:
            bVar5 = false;
            uVar25 = 0;
          }
          else {
            uVar25 = 0;
            bVar5 = false;
            do {
              uVar27 = (ulong)*(byte *)(lVar21 + uVar25);
              uVar18 = (&uStack_68)[uVar25 * 2];
              if ((*(uint *)(X86InstDB::oSignatureData + uVar27 * 8) & uVar18) == 0) {
                if (((uVar18 & 0x7fc0000) == 0) ||
                   (bVar31 = true,
                   (*(uint *)(X86InstDB::oSignatureData + uVar27 * 8) & 0x7fc0000) == 0))
                goto LAB_00166b76;
              }
              else {
                uVar26 = (&uStack_64)[uVar25 * 4];
                if (((uVar26 != 0) &&
                    (((*(ushort *)(X86InstDB::oSignatureData + uVar27 * 8 + 4) & uVar26) == 0 ||
                     (((uVar26 >> 0xb & 1) == 0 &&
                      ((*(ushort *)(X86InstDB::oSignatureData + uVar27 * 8 + 4) & 0x800) != 0))))))
                   || ((bVar31 = bVar5, (uVar18 & 0x7fff) != 0 &&
                       ((X86InstDB::oSignatureData[uVar27 * 8 + 7] != 0 &&
                        ((abStack_61[uVar25 * 8] & X86InstDB::oSignatureData[uVar27 * 8 + 7]) == 0))
                       )))) goto LAB_00166b76;
              }
              bVar5 = bVar31;
              uVar25 = uVar25 + 1;
            } while (uVar11 != uVar25);
            uVar25 = (ulong)uVar13;
          }
        }
        else {
          bVar5 = false;
          if ((uVar18 - (bVar24 >> 5) != uVar13) || (uVar13 == 0)) goto LAB_00166b73;
          uVar25 = 0;
          if ((char)uVar18 != '\0') {
            uVar27 = 0;
            uVar29 = 0;
            uVar25 = 0;
            bVar5 = false;
            do {
              pbVar17 = (byte *)((ulong)uVar29 + lVar21);
              while( true ) {
                uVar8 = (ulong)*pbVar17;
                uVar28 = *(uint *)(X86InstDB::oSignatureData + uVar8 * 8);
                if (-1 < (int)uVar28) break;
                uVar29 = uVar29 + 1;
                pbVar17 = pbVar17 + 1;
                if (uVar18 <= uVar29) goto LAB_00166b6a;
              }
              uVar19 = (&uStack_68)[uVar27 * 2];
              if ((uVar19 & uVar28) == 0) {
                if (((uVar28 & 0x7fc0000) == 0) || (bVar31 = true, (uVar19 & 0x7fc0000) == 0)) {
                  uVar25 = uVar27 & 0xffffffff;
                  break;
                }
              }
              else {
                uVar26 = (&uStack_64)[uVar27 * 4];
                if (((uVar26 != 0) &&
                    (((*(ushort *)(X86InstDB::oSignatureData + uVar8 * 8 + 4) & uVar26) == 0 ||
                     (((uVar26 >> 0xb & 1) == 0 &&
                      ((*(ushort *)(X86InstDB::oSignatureData + uVar8 * 8 + 4) & 0x800) != 0))))))
                   || ((bVar31 = bVar5, (uVar19 & 0x7fff) != 0 &&
                       ((X86InstDB::oSignatureData[uVar8 * 8 + 7] != 0 &&
                        ((abStack_61[uVar27 * 8] & X86InstDB::oSignatureData[uVar8 * 8 + 7]) == 0)))
                       ))) {
LAB_00166b6a:
                  uVar25 = uVar27 & 0xffffffff;
                  break;
                }
              }
              bVar5 = bVar31;
              uVar27 = uVar27 + 1;
              uVar25 = (ulong)((int)uVar25 + 1);
              if ((uVar11 <= uVar27) || (uVar29 = uVar29 + 1, uVar18 <= uVar29)) break;
            } while( true );
          }
        }
LAB_00166b76:
        bVar30 = (uint)uVar25 == uVar13;
        bVar31 = bVar12;
        if (bVar30) {
          bVar31 = bVar5;
        }
        bVar12 = bVar31;
        if (!bVar5 && bVar30) {
          if (pbVar9 != pbVar1) goto LAB_00166bb6;
          break;
        }
      }
      pbVar9 = pbVar9 + 8;
      lVar21 = lVar21 + 8;
    } while (pbVar9 != pbVar1);
    bVar31 = !bVar31;
    EVar10 = 0x2c;
    EVar7 = 0x16;
LAB_00166c00:
    if (!bVar31) {
      EVar7 = EVar10;
    }
switchD_00166544_default:
    return EVar7;
  }
  uVar11 = (ulong)count;
  local_a0 = (Operand_ *)0x0;
  uVar13 = 0x4032;
  if (archType != 1) {
    uVar13 = 0x4062;
  }
  uVar19 = 0xe30;
  if (archType != 1) {
    uVar19 = 0xe60;
  }
  uVar27 = 0;
  uVar28 = 0;
  uVar29 = 0;
  pOVar16 = operands;
LAB_00166528:
  uVar14 = (pOVar16->field_0)._any.signature;
  EVar7 = 4;
  switch(uVar14 & 7) {
  case 0:
    pOVar16 = operands + (uVar11 - 1);
    uVar25 = uVar11;
    while (uVar25 = uVar25 - 1, uVar27 < uVar25) {
      paVar6 = &pOVar16->field_0;
      pOVar16 = pOVar16 + -1;
      if ((undefined1  [16])((undefined1  [16])*paVar6 & (undefined1  [16])0x7) !=
          (undefined1  [16])0x0) {
        return 4;
      }
    }
LAB_00166902:
    uVar13 = (uint)uVar25;
    goto LAB_00166913;
  case 1:
    uVar14 = uVar14 >> 3 & 0x1f;
    if (0x15 < uVar14) {
      return 0x17;
    }
    uVar20 = *(uint *)(_x86OpFlagFromRegType + (ulong)uVar14 * 4);
    if (uVar20 == 0) {
      return 0x17;
    }
    uVar23 = (pOVar16->field_0)._any.id;
    if (uVar23 < 0x100) {
      if (0x1f < uVar23) {
        return 0x19;
      }
      if ((*(uint *)(puVar15 + (ulong)uVar14 * 4) >> (uVar23 & 0x1f) & 1) == 0) {
        return 0x19;
      }
      uVar14 = 1 << (uVar23 & 0x1f);
      uVar29 = uVar29 | uVar14;
    }
    else {
      uVar14 = 0xffffffff;
    }
    goto LAB_001665d8;
  case 2:
    if ((~uVar14 & 0xe00000) == 0) {
      return 0x2b;
    }
    uVar23 = uVar14 >> 3 & 0x1f;
    uVar20 = uVar14 >> 8 & 0x1f;
    if (uVar23 == 0) {
      if ((archType == 1) && (2 < (pOVar16->field_0)._mem.field_2.offset64 + 0x80000000 >> 0x1f)) {
        return 0x26;
      }
      if (uVar20 != 0) goto LAB_001666ce;
      uVar20 = 0x10000;
      bVar24 = 0;
      uVar26 = 0;
    }
    else {
      uVar4 = (pOVar16->field_0)._any.reserved12_4;
      if (((uVar14 >> 0x10 & 1) == 0) && ((uVar13 >> (uVar14 >> 3 & 0x1f) & 1) == 0)) {
        return 0x26;
      }
      bVar24 = 0xff;
      if (uVar4 < 0x100) {
        if (0x1f < uVar4) {
          validate();
          goto LAB_00166d34;
        }
        uVar29 = uVar29 | 1 << (uVar4 & 0x1f);
        bVar24 = (byte)(1 << (uVar4 & 0x1f));
      }
      if (uVar20 == 0) {
        uVar20 = 0x10000;
        uVar26 = (ushort)((pOVar16->field_0)._any.reserved8_4 == 0) << 0xb;
      }
      else {
LAB_001666ce:
        if ((uVar19 >> (uVar14 >> 8 & 0x1f) & 1) == 0) {
          return 0x26;
        }
        if (uVar20 - 9 < 3) {
          if (uVar23 == 0xe) {
            return 0x26;
          }
          uVar26 = (ushort)(0x4400220011 >> ((ulong)((uVar20 - 9) * 0x10) & 0x3f));
          uVar20 = 0x20000;
        }
        else {
          uVar20 = 0x10000;
          uVar26 = (ushort)(uVar23 != 0) << 0xe;
        }
        uVar23 = (pOVar16->field_0)._any.id;
        bVar24 = 0;
        if (uVar23 < 0x100) {
          if (0x1f < uVar23) {
LAB_00166d34:
            validate();
            return 0x1b;
          }
          uVar29 = uVar29 | 1 << (uVar23 & 0x1f);
        }
      }
    }
    uVar14 = uVar14 >> 0x18;
    EVar7 = 0x2d;
    local_a0 = pOVar16;
    switch(uVar14) {
    case 0:
      uVar26 = uVar26 | 0x8000;
      break;
    case 1:
      uVar26 = uVar26 | 1;
      break;
    case 2:
      uVar26 = uVar26 | 2;
      break;
    case 3:
    case 5:
    case 7:
    case 9:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
      goto switchD_00166544_default;
    case 4:
      uVar26 = uVar26 | 4;
      break;
    case 6:
      uVar26 = uVar26 | 8;
      break;
    case 8:
      uVar26 = uVar26 | 0x10;
      break;
    case 10:
      uVar26 = uVar26 | 0x20;
      break;
    case 0x10:
      uVar26 = uVar26 | 0x40;
      break;
    default:
      if (uVar14 == 0x20) {
        uVar26 = uVar26 | 0x80;
      }
      else {
        if (uVar14 != 0x40) {
          return 0x2d;
        }
        uVar26 = uVar26 | 0x100;
      }
    }
    goto LAB_001665da;
  case 3:
    uVar8 = *(ulong *)((long)&pOVar16->field_0 + 8);
    if ((long)uVar8 < 0) {
      uVar8 = -uVar8;
      if (uVar8 < 0x81) {
        uVar20 = 0x2a80000;
      }
      else if (uVar8 < 0x8001) {
        uVar20 = 0x2a00000;
      }
      else {
        uVar20 = (uVar8 < 0x80000001 | 4) << 0x17;
      }
    }
    else if (uVar8 < 0x10) {
      uVar20 = 0x7fc0000;
    }
    else if (uVar8 < 0x80) {
      uVar20 = 0x7f80000;
    }
    else if (uVar8 < 0x100) {
      uVar20 = 0x7f00000;
    }
    else if (uVar8 < 0x8000) {
      uVar20 = 0x7e00000;
    }
    else if (uVar8 < 0x10000) {
      uVar20 = 0x7c00000;
    }
    else if (uVar8 >> 0x1f == 0) {
      uVar20 = 0x7800000;
    }
    else {
      uVar20 = (uVar8 >> 0x20 == 0 | 6) << 0x18;
    }
    break;
  case 4:
    uVar20 = 0x18000000;
    break;
  default:
    goto switchD_00166544_default;
  }
  uVar14 = 0;
LAB_001665d8:
  bVar24 = (byte)uVar14;
  uVar26 = 0;
LAB_001665da:
  (&uStack_68)[uVar27 * 2] = uVar20;
  (&uStack_64)[uVar27 * 4] = uVar26;
  abStack_61[uVar27 * 8] = bVar24;
  uVar28 = uVar28 | uVar20;
  uVar27 = uVar27 + 1;
  pOVar16 = pOVar16 + 1;
  if (uVar11 == uVar27) goto LAB_00166902;
  goto LAB_00166528;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86InstImpl::validate(uint32_t archType, const Inst::Detail& detail, const Operand_* operands, uint32_t count) noexcept {
  uint32_t i;
  uint32_t archMask;
  const X86ValidationData* vd;

  if (!ArchInfo::isX86Family(archType))
    return DebugUtils::errored(kErrorInvalidArch);

  if (archType == ArchInfo::kTypeX86) {
    vd = &_x86ValidationData;
    archMask = X86Inst::kArchMaskX86;
  }
  else {
    vd = &_x64ValidationData;
    archMask = X86Inst::kArchMaskX64;
  }

  // Get the instruction data.
  uint32_t instId = detail.instId;
  uint32_t options = detail.options;

  if (ASMJIT_UNLIKELY(instId >= X86Inst::_kIdCount))
    return DebugUtils::errored(kErrorInvalidArgument);

  const X86Inst* iData = &X86InstDB::instData[instId];
  uint32_t iFlags = iData->getFlags();

  // Validate LOCK, XACQUIRE, and XRELEASE prefixes.
  const uint32_t kLockXAcqRel = X86Inst::kOptionXAcquire | X86Inst::kOptionXRelease;
  if (options & (X86Inst::kOptionLock | kLockXAcqRel)) {
    if (options & X86Inst::kOptionLock) {
      if (ASMJIT_UNLIKELY(!(iFlags & X86Inst::kFlagLock) && !(options & kLockXAcqRel)))
        return DebugUtils::errored(kErrorInvalidLockPrefix);

      if (ASMJIT_UNLIKELY(count < 1 || !operands[0].isMem()))
        return DebugUtils::errored(kErrorInvalidLockPrefix);
    }

    if (options & kLockXAcqRel) {
      if (ASMJIT_UNLIKELY(!(options & X86Inst::kOptionLock) || (options & kLockXAcqRel) == kLockXAcqRel))
        return DebugUtils::errored(kErrorInvalidPrefixCombination);

      if (ASMJIT_UNLIKELY((options & X86Inst::kOptionXAcquire) && !(iFlags & X86Inst::kFlagXAcquire)))
        return DebugUtils::errored(kErrorInvalidXAcquirePrefix);

      if (ASMJIT_UNLIKELY((options & X86Inst::kOptionXRelease) && !(iFlags & X86Inst::kFlagXRelease)))
        return DebugUtils::errored(kErrorInvalidXReleasePrefix);
    }
  }

  // Validate REP and REPNZ prefixes.
  const uint32_t kRepRepRepnz = X86Inst::kOptionRep | X86Inst::kOptionRepnz;
  if (options & kRepRepRepnz) {
    if (ASMJIT_UNLIKELY((options & kRepRepRepnz) == kRepRepRepnz))
      return DebugUtils::errored(kErrorInvalidPrefixCombination);

    if (ASMJIT_UNLIKELY((options & X86Inst::kOptionRep) && !(iFlags & X86Inst::kFlagRep)))
      return DebugUtils::errored(kErrorInvalidRepPrefix);

    if (ASMJIT_UNLIKELY((options & X86Inst::kOptionRepnz) && !(iFlags & X86Inst::kFlagRepnz)))
      return DebugUtils::errored(kErrorInvalidRepPrefix);

    // TODO: Validate extraReg {cx|ecx|rcx}.
  }

  // Translate the given operands to `X86Inst::OSignature`.
  X86Inst::OSignature oSigTranslated[6];
  uint32_t combinedOpFlags = 0;
  uint32_t combinedRegMask = 0;

  const X86Mem* memOp = nullptr;

  for (i = 0; i < count; i++) {
    const Operand_& op = operands[i];
    if (op.getOp() == Operand::kOpNone) break;

    uint32_t opFlags = 0;
    uint32_t memFlags = 0;
    uint32_t regMask = 0;

    switch (op.getOp()) {
      case Operand::kOpReg: {
        uint32_t regType = op.as<Reg>().getType();
        if (ASMJIT_UNLIKELY(regType >= X86Reg::kRegCount))
          return DebugUtils::errored(kErrorInvalidRegType);

        opFlags = _x86OpFlagFromRegType[regType];
        if (ASMJIT_UNLIKELY(opFlags == 0))
          return DebugUtils::errored(kErrorInvalidRegType);

        // If `regId` is equal or greater than Operand::kPackedIdMin it means
        // that the register is virtual and its index will be assigned later
        // by the register allocator. We must pass unless asked to disallow
        // virtual registers.
        // TODO: We need an option to refuse virtual regs here.
        uint32_t regId = op.getId();
        if (regId < Operand::kPackedIdMin) {
          if (ASMJIT_UNLIKELY(regId >= 32))
            return DebugUtils::errored(kErrorInvalidPhysId);

          regMask = Utils::mask(regId);
          if (ASMJIT_UNLIKELY((vd->allowedRegMask[regType] & regMask) == 0))
            return DebugUtils::errored(kErrorInvalidPhysId);

          combinedRegMask |= regMask;
        }
        else {
          regMask = 0xFFFFFFFFU;
        }
        break;
      }

      // TODO: Validate base and index and combine with `combinedRegMask`.
      case Operand::kOpMem: {
        const X86Mem& m = op.as<X86Mem>();

        uint32_t baseType = m.getBaseType();
        uint32_t indexType = m.getIndexType();

        memOp = &m;

        if (m.getSegmentId() > 6)
          return DebugUtils::errored(kErrorInvalidSegment);

        if (baseType) {
          uint32_t baseId = m.getBaseId();

          if (m.isRegHome()) {
            // Home address of virtual register. In such case we don't want to
            // validate the type of the base register as it will always be patched
            // to ESP|RSP.
          }
          else {
            if (ASMJIT_UNLIKELY((vd->allowedMemBaseRegs & (1U << baseType)) == 0))
              return DebugUtils::errored(kErrorInvalidAddress);
          }

          // Create information that will be validated only if this is an implicit
          // memory operand. Basically only usable for string instructions and other
          // instructions where memory operand is implicit and has 'seg:[reg]' form.
          if (baseId < Operand::kPackedIdMin) {
            // Physical base id.
            regMask = Utils::mask(baseId);
            combinedRegMask |= regMask;
          }
          else {
            // Virtual base id - will the whole mask for implicit mem validation.
            // The register is not assigned yet, so we cannot predict the phys id.
            regMask = 0xFFFFFFFFU;
          }

          if (!indexType && !m.getOffsetLo32())
            memFlags |= X86Inst::kMemOpBaseOnly;
        }
        else {
          // Base is an address, make sure that the address doesn't overflow 32-bit
          // integer (either int32_t or uint32_t) in 32-bit targets.
          int64_t offset = m.getOffset();
          if (archMask == X86Inst::kArchMaskX86 && !Utils::isInt32(offset) && !Utils::isUInt32(offset))
            return DebugUtils::errored(kErrorInvalidAddress);
        }

        if (indexType) {
          if (ASMJIT_UNLIKELY((vd->allowedMemIndexRegs & (1U << indexType)) == 0))
            return DebugUtils::errored(kErrorInvalidAddress);

          if (indexType == X86Reg::kRegXmm) {
            opFlags |= X86Inst::kOpVm;
            memFlags |= X86Inst::kMemOpVm32x | X86Inst::kMemOpVm64x;
          }
          else if (indexType == X86Reg::kRegYmm) {
            opFlags |= X86Inst::kOpVm;
            memFlags |= X86Inst::kMemOpVm32y | X86Inst::kMemOpVm64y;
          }
          else if (indexType == X86Reg::kRegZmm) {
            opFlags |= X86Inst::kOpVm;
            memFlags |= X86Inst::kMemOpVm32z | X86Inst::kMemOpVm64z;
          }
          else {
            opFlags |= X86Inst::kOpMem;
            if (baseType)
              memFlags |= X86Inst::kMemOpMib;
          }

          // [RIP + {XMM|YMM|ZMM}] is not allowed.
          if (baseType == X86Reg::kRegRip && (opFlags & X86Inst::kOpVm))
            return DebugUtils::errored(kErrorInvalidAddress);

          uint32_t indexId = m.getIndexId();
          if (indexId < Operand::kPackedIdMin)
            combinedRegMask |= Utils::mask(indexId);

          // Only used for implicit memory operands having 'seg:[reg]' form, so clear it.
          regMask = 0;
        }
        else {
          opFlags |= X86Inst::kOpMem;
        }

        switch (m.getSize()) {
          case  0: memFlags |= X86Inst::kMemOpAny ; break;
          case  1: memFlags |= X86Inst::kMemOpM8  ; break;
          case  2: memFlags |= X86Inst::kMemOpM16 ; break;
          case  4: memFlags |= X86Inst::kMemOpM32 ; break;
          case  6: memFlags |= X86Inst::kMemOpM48 ; break;
          case  8: memFlags |= X86Inst::kMemOpM64 ; break;
          case 10: memFlags |= X86Inst::kMemOpM80 ; break;
          case 16: memFlags |= X86Inst::kMemOpM128; break;
          case 32: memFlags |= X86Inst::kMemOpM256; break;
          case 64: memFlags |= X86Inst::kMemOpM512; break;
          default:
            return DebugUtils::errored(kErrorInvalidOperandSize);
        }

        break;
      }

      case Operand::kOpImm: {
        uint64_t immValue = op.as<Imm>().getUInt64();
        uint32_t immFlags = 0;

        if (static_cast<int64_t>(immValue) >= 0) {
          const uint32_t k32AndMore = X86Inst::kOpI32 | X86Inst::kOpU32 |
                                      X86Inst::kOpI64 | X86Inst::kOpU64 ;

          if (immValue <= 0xFU)
            immFlags = X86Inst::kOpU4 | X86Inst::kOpI8 | X86Inst::kOpU8 | X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0x7FU)
            immFlags = X86Inst::kOpI8 | X86Inst::kOpU8 | X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0xFFU)
            immFlags = X86Inst::kOpU8 | X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0x7FFFU)
            immFlags = X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0xFFFFU)
            immFlags = X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0x7FFFFFFFU)
            immFlags = k32AndMore;
          else if (immValue <= 0xFFFFFFFFU)
            immFlags = X86Inst::kOpU32 | X86Inst::kOpI64 | X86Inst::kOpU64;
          else if (immValue <= ASMJIT_UINT64_C(0x7FFFFFFFFFFFFFFF))
            immFlags = X86Inst::kOpI64 | X86Inst::kOpU64;
          else
            immFlags = X86Inst::kOpU64;
        }
        else {
          // 2s complement negation, as our number is unsigned...
          immValue = (~immValue + 1);

          if (immValue <= 0x80U)
            immFlags = X86Inst::kOpI8 | X86Inst::kOpI16 | X86Inst::kOpI32 | X86Inst::kOpI64;
          else if (immValue <= 0x8000U)
            immFlags = X86Inst::kOpI16 | X86Inst::kOpI32 | X86Inst::kOpI64;
          else if (immValue <= 0x80000000U)
            immFlags = X86Inst::kOpI32 | X86Inst::kOpI64;
          else
            immFlags = X86Inst::kOpI64;
        }
        opFlags |= immFlags;
        break;
      }

      case Operand::kOpLabel: {
        opFlags |= X86Inst::kOpRel8 | X86Inst::kOpRel32;
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    X86Inst::OSignature& tod = oSigTranslated[i];
    tod.flags = opFlags;
    tod.memFlags = static_cast<uint16_t>(memFlags);
    tod.regMask = static_cast<uint8_t>(regMask & 0xFFU);
    combinedOpFlags |= opFlags;
  }

  // Decrease the number of operands of those that are none. This is important
  // as Assembler and CodeCompiler may just pass more operands where some of
  // them are none (it means that no operand is given at that index). However,
  // validate that there are no gaps (like [reg, none, reg] or [none, reg]).
  if (i < count) {
    while (--count > i)
      if (ASMJIT_UNLIKELY(!operands[count].isNone()))
        return DebugUtils::errored(kErrorInvalidState);
  }

  // Validate X86 and X64 specific cases.
  if (archMask == X86Inst::kArchMaskX86) {
    // Illegal use of 64-bit register in 32-bit mode.
    if (ASMJIT_UNLIKELY((combinedOpFlags & X86Inst::kOpGpq) != 0))
      return DebugUtils::errored(kErrorInvalidUseOfGpq);
  }
  else {
    // Illegal use of a high 8-bit register with REX prefix.
    if (ASMJIT_UNLIKELY((combinedOpFlags & X86Inst::kOpGpbHi) != 0 && (combinedRegMask & 0xFFFFFF00U) != 0))
      return DebugUtils::errored(kErrorInvalidUseOfGpbHi);
  }

  // Validate instruction operands.
  const X86Inst::CommonData* commonData = &iData->getCommonData();
  const X86Inst::ISignature* iSig = X86InstDB::iSignatureData + commonData->_iSignatureIndex;
  const X86Inst::ISignature* iEnd = iSig                      + commonData->_iSignatureCount;

  if (iSig != iEnd) {
    const X86Inst::OSignature* oSigData = X86InstDB::oSignatureData;

    // If set it means that we matched a signature where only immediate value
    // was out of bounds. We can return a more descriptive error if we know this.
    bool globalImmOutOfRange = false;

    do {
      // Check if the architecture is compatible.
      if ((iSig->archMask & archMask) == 0) continue;

      // Compare the operands table with reference operands.
      uint32_t j = 0;
      uint32_t iSigCount = iSig->opCount;
      bool localImmOutOfRange = false;

      if (iSigCount == count) {
        for (j = 0; j < count; j++)
          if (!x86CheckOSig(oSigTranslated[j], oSigData[iSig->operands[j]], localImmOutOfRange))
            break;
      }
      else if (iSigCount - iSig->implicit == count) {
        uint32_t r = 0;
        for (j = 0; j < count && r < iSigCount; j++, r++) {
          const X86Inst::OSignature* oChk = oSigTranslated + j;
          const X86Inst::OSignature* oRef;
Next:
          oRef = oSigData + iSig->operands[r];
          // Skip implicit.
          if ((oRef->flags & X86Inst::kOpImplicit) != 0) {
            if (++r >= iSigCount)
              break;
            else
              goto Next;
          }

          if (!x86CheckOSig(*oChk, *oRef, localImmOutOfRange))
            break;
        }
      }

      if (j == count) {
        if (!localImmOutOfRange) {
          // Match, must clear possible `globalImmOutOfRange`.
          globalImmOutOfRange = false;
          break;
        }
        globalImmOutOfRange = localImmOutOfRange;
      }
    } while (++iSig != iEnd);

    if (iSig == iEnd) {
      if (globalImmOutOfRange)
        return DebugUtils::errored(kErrorInvalidImmediate);
      else
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  // Validate AVX-512 options:
  const RegOnly& extraReg = detail.extraReg;
  const uint32_t kAvx512Options = X86Inst::kOptionZMask   |
                                  X86Inst::kOption1ToX    |
                                  X86Inst::kOptionER      |
                                  X86Inst::kOptionSAE     ;

  if (!extraReg.isNone() || (options & kAvx512Options)) {
    if (commonData->hasFlag(X86Inst::kFlagEvex)) {
      // Validate AVX-512 {k} and {k}{z}.
      if (!extraReg.isNone()) {
        // Mask can only be specified by a 'k' register.
        if (ASMJIT_UNLIKELY(extraReg.getType() != X86Reg::kRegK))
          return DebugUtils::errored(kErrorInvalidKMaskReg);

        if (ASMJIT_UNLIKELY(!commonData->hasAvx512K()))
          return DebugUtils::errored(kErrorInvalidKMaskUse);
      }

      if ((options & X86Inst::kOptionZMask)) {
        if (ASMJIT_UNLIKELY((options & X86Inst::kOptionZMask) != 0 && !commonData->hasAvx512Z()))
          return DebugUtils::errored(kErrorInvalidKZeroUse);
      }

      // Validate AVX-512 broadcast {1tox}.
      if (options & X86Inst::kOption1ToX) {
        if (ASMJIT_UNLIKELY(!memOp))
          return DebugUtils::errored(kErrorInvalidBroadcast);

        uint32_t size = memOp->getSize();
        if (size != 0) {
          // The the size is specified it has to match the broadcast size.
          if (ASMJIT_UNLIKELY(commonData->hasAvx512B32() && size != 4))
            return DebugUtils::errored(kErrorInvalidBroadcast);

          if (ASMJIT_UNLIKELY(commonData->hasAvx512B64() && size != 8))
            return DebugUtils::errored(kErrorInvalidBroadcast);
        }
      }

      // Validate AVX-512 {sae} and {er}.
      if (options & (X86Inst::kOptionSAE | X86Inst::kOptionER)) {
        // Rounding control is impossible if the instruction is not reg-to-reg.
        if (ASMJIT_UNLIKELY(memOp))
          return DebugUtils::errored(kErrorInvalidEROrSAE);

        // Check if {sae} or {er} is supported by the instruction.
        if (options & X86Inst::kOptionER) {
          // NOTE: if both {sae} and {er} are set, we don't care, as {sae} is implied.
          if (ASMJIT_UNLIKELY(!commonData->hasAvx512ER()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);

          // {er} is defined for scalar ops or vector ops using zmm (LL = 10). We
          // don't need any more bits in the instruction database to be able to
          // validate this, as each AVX512 instruction that has broadcast is vector
          // instruction (in this case we require zmm registers), otherwise it's a
          // scalar instruction, which is valid.
          if (commonData->hasAvx512B()) {
            // Supports broadcast, thus we require LL to be '10', which means there
            // have to be zmm registers used. We don't calculate LL here, but we know
            // that it would be '10' if there is at least one ZMM register used.

            // There is no 'ER' enabled instruction with less than two operands.
            ASMJIT_ASSERT(count >= 2);
            if (ASMJIT_UNLIKELY(!X86Reg::isZmm(operands[0]) && !X86Reg::isZmm(operands[1])))
              return DebugUtils::errored(kErrorInvalidEROrSAE);
          }
        }
        else {
          // {sae} doesn't have the same limitations as {er}, this is enough.
          if (ASMJIT_UNLIKELY(!commonData->hasAvx512SAE()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }
      }
    }
    else {
      // Not AVX512 instruction - maybe OpExtra is xCX register used by REP/REPNZ prefix. Otherwise the instruction is invalid.
      if ((options & kAvx512Options) || (options & (X86Inst::kOptionRep | X86Inst::kOptionRepnz)) == 0)
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  return kErrorOk;
}